

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

int xmlRelaxNGIsCompilable(xmlRelaxNGDefinePtr_conflict def)

{
  ushort uVar1;
  xmlRelaxNGDefinePtr_conflict local_38;
  xmlRelaxNGDefinePtr_conflict list_2;
  xmlRelaxNGDefinePtr_conflict list_1;
  xmlRelaxNGDefinePtr_conflict list;
  int ret;
  xmlRelaxNGDefinePtr_conflict def_local;
  
  list._4_4_ = -1;
  if (def == (xmlRelaxNGDefinePtr_conflict)0x0) {
    def_local._4_4_ = -1;
  }
  else if ((def->type == XML_RELAXNG_ELEMENT) || ((def->dflags & 0x40U) == 0)) {
    if ((def->type == XML_RELAXNG_ELEMENT) || ((def->dflags & 0x80U) == 0)) {
      switch(def->type) {
      case XML_RELAXNG_EMPTY:
      case XML_RELAXNG_TEXT:
        list._4_4_ = 1;
        break;
      case XML_RELAXNG_NOT_ALLOWED:
      case XML_RELAXNG_EXCEPT:
      case XML_RELAXNG_DATATYPE:
      case XML_RELAXNG_PARAM:
      case XML_RELAXNG_VALUE:
      case XML_RELAXNG_LIST:
      case XML_RELAXNG_ATTRIBUTE:
      case XML_RELAXNG_INTERLEAVE:
        list._4_4_ = 0;
        break;
      case XML_RELAXNG_ELEMENT:
        if (((def->dflags & 0x80U) == 0) && ((def->dflags & 0x40U) == 0)) {
          list_1 = def->content;
          while ((list_1 != (xmlRelaxNGDefinePtr_conflict)0x0 &&
                 (list._4_4_ = xmlRelaxNGIsCompilable(list_1), list._4_4_ == 1))) {
            list_1 = list_1->next;
          }
          if (list._4_4_ == 0) {
            def->dflags = def->dflags & 0xffbf;
            def->dflags = def->dflags | 0x80;
          }
          if ((list._4_4_ == 1) && (uVar1 = def->dflags & 0x80, def->dflags = uVar1, uVar1 == 0)) {
            def->dflags = def->dflags | 0x40;
          }
        }
        if ((def->nameClass == (xmlRelaxNGDefinePtr)0x0) && (def->name != (xmlChar *)0x0)) {
          list._4_4_ = 1;
        }
        else {
          list._4_4_ = 0;
        }
        return list._4_4_;
      case XML_RELAXNG_DEF:
      case XML_RELAXNG_OPTIONAL:
      case XML_RELAXNG_ZEROORMORE:
      case XML_RELAXNG_ONEORMORE:
      case XML_RELAXNG_CHOICE:
      case XML_RELAXNG_GROUP:
      case XML_RELAXNG_START:
        local_38 = def->content;
        while ((local_38 != (xmlRelaxNGDefinePtr_conflict)0x0 &&
               (list._4_4_ = xmlRelaxNGIsCompilable(local_38), list._4_4_ == 1))) {
          local_38 = local_38->next;
        }
        break;
      case XML_RELAXNG_REF:
      case XML_RELAXNG_EXTERNALREF:
      case XML_RELAXNG_PARENTREF:
        if (def->depth == -0x14) {
          return 1;
        }
        def->depth = -0x14;
        list_2 = def->content;
        while ((list_2 != (xmlRelaxNGDefinePtr_conflict)0x0 &&
               (list._4_4_ = xmlRelaxNGIsCompilable(list_2), list._4_4_ == 1))) {
          list_2 = list_2->next;
        }
        break;
      case XML_RELAXNG_NOOP:
        list._4_4_ = xmlRelaxNGIsCompilable(def->content);
      }
      if (list._4_4_ == 0) {
        def->dflags = def->dflags | 0x80;
      }
      if (list._4_4_ == 1) {
        def->dflags = def->dflags | 0x40;
      }
      def_local._4_4_ = list._4_4_;
    }
    else {
      def_local._4_4_ = 0;
    }
  }
  else {
    def_local._4_4_ = 1;
  }
  return def_local._4_4_;
}

Assistant:

static int
xmlRelaxNGIsCompilable(xmlRelaxNGDefinePtr def)
{
    int ret = -1;

    if (def == NULL) {
        return (-1);
    }
    if ((def->type != XML_RELAXNG_ELEMENT) &&
        (def->dflags & IS_COMPILABLE))
        return (1);
    if ((def->type != XML_RELAXNG_ELEMENT) &&
        (def->dflags & IS_NOT_COMPILABLE))
        return (0);
    switch (def->type) {
        case XML_RELAXNG_NOOP:
            ret = xmlRelaxNGIsCompilable(def->content);
            break;
        case XML_RELAXNG_TEXT:
        case XML_RELAXNG_EMPTY:
            ret = 1;
            break;
        case XML_RELAXNG_ELEMENT:
            /*
             * Check if the element content is compilable
             */
            if (((def->dflags & IS_NOT_COMPILABLE) == 0) &&
                ((def->dflags & IS_COMPILABLE) == 0)) {
                xmlRelaxNGDefinePtr list;

                list = def->content;
                while (list != NULL) {
                    ret = xmlRelaxNGIsCompilable(list);
                    if (ret != 1)
                        break;
                    list = list->next;
                }
		/*
		 * Because the routine is recursive, we must guard against
		 * discovering both COMPILABLE and NOT_COMPILABLE
		 */
                if (ret == 0) {
		    def->dflags &= ~IS_COMPILABLE;
                    def->dflags |= IS_NOT_COMPILABLE;
		}
                if ((ret == 1) && !(def->dflags &= IS_NOT_COMPILABLE))
                    def->dflags |= IS_COMPILABLE;
            }
            /*
             * All elements return a compilable status unless they
             * are generic like anyName
             */
            if ((def->nameClass != NULL) || (def->name == NULL))
                ret = 0;
            else
                ret = 1;
            return (ret);
        case XML_RELAXNG_REF:
        case XML_RELAXNG_EXTERNALREF:
        case XML_RELAXNG_PARENTREF:
            if (def->depth == -20) {
                return (1);
            } else {
                xmlRelaxNGDefinePtr list;

                def->depth = -20;
                list = def->content;
                while (list != NULL) {
                    ret = xmlRelaxNGIsCompilable(list);
                    if (ret != 1)
                        break;
                    list = list->next;
                }
            }
            break;
        case XML_RELAXNG_START:
        case XML_RELAXNG_OPTIONAL:
        case XML_RELAXNG_ZEROORMORE:
        case XML_RELAXNG_ONEORMORE:
        case XML_RELAXNG_CHOICE:
        case XML_RELAXNG_GROUP:
        case XML_RELAXNG_DEF:{
                xmlRelaxNGDefinePtr list;

                list = def->content;
                while (list != NULL) {
                    ret = xmlRelaxNGIsCompilable(list);
                    if (ret != 1)
                        break;
                    list = list->next;
                }
                break;
            }
        case XML_RELAXNG_EXCEPT:
        case XML_RELAXNG_ATTRIBUTE:
        case XML_RELAXNG_INTERLEAVE:
        case XML_RELAXNG_DATATYPE:
        case XML_RELAXNG_LIST:
        case XML_RELAXNG_PARAM:
        case XML_RELAXNG_VALUE:
        case XML_RELAXNG_NOT_ALLOWED:
            ret = 0;
            break;
    }
    if (ret == 0)
        def->dflags |= IS_NOT_COMPILABLE;
    if (ret == 1)
        def->dflags |= IS_COMPILABLE;
    return (ret);
}